

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bamtools_convert.cpp
# Opt level: O0

void __thiscall
BamTools::ConvertTool::ConvertToolPrivate::PrintBed(ConvertToolPrivate *this,BamAlignment *a)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  reference pvVar4;
  BamAlignment *in_RSI;
  long in_RDI;
  size_type in_stack_ffffffffffffffc8;
  undefined1 in_stack_ffffffffffffffee;
  undefined1 in_stack_ffffffffffffffef;
  char cVar5;
  
  poVar3 = (ostream *)(in_RDI + 0x20);
  pvVar4 = std::vector<BamTools::RefData,_std::allocator<BamTools::RefData>_>::at
                     ((vector<BamTools::RefData,_std::allocator<BamTools::RefData>_> *)poVar3,
                      in_stack_ffffffffffffffc8);
  poVar3 = std::operator<<(poVar3,(string *)pvVar4);
  poVar3 = std::operator<<(poVar3,'\t');
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,in_RSI->Position);
  poVar3 = std::operator<<(poVar3,'\t');
  iVar2 = BamAlignment::GetEndPosition
                    (in_RSI,(bool)in_stack_ffffffffffffffef,(bool)in_stack_ffffffffffffffee);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar2);
  poVar3 = std::operator<<(poVar3,'\t');
  poVar3 = std::operator<<(poVar3,(string *)in_RSI);
  poVar3 = std::operator<<(poVar3,'\t');
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,in_RSI->MapQuality);
  poVar3 = std::operator<<(poVar3,'\t');
  bVar1 = BamAlignment::IsReverseStrand(in_RSI);
  cVar5 = '-';
  if (!bVar1) {
    cVar5 = '+';
  }
  poVar3 = std::operator<<(poVar3,cVar5);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void ConvertTool::ConvertToolPrivate::PrintBed(const BamAlignment& a)
{

    // tab-delimited, 0-based half-open
    // (e.g. a 50-base read aligned to pos 10 could have BED coordinates (10, 60) instead of BAM coordinates (10, 59) )
    // <chromName> <chromStart> <chromEnd> <readName> <score> <strand>

    m_out << m_references.at(a.RefID).RefName << '\t' << a.Position << '\t' << a.GetEndPosition()
          << '\t' << a.Name << '\t' << a.MapQuality << '\t' << (a.IsReverseStrand() ? '-' : '+')
          << std::endl;
}